

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O3

ParseLocation * __thiscall
embree::TokenStream::location(ParseLocation *__return_storage_ptr__,TokenStream *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ssize_t sVar2;
  ParseLocation *pPVar3;
  
  pPVar3 = Stream<int>::loc((this->cin).ptr);
  (__return_storage_ptr__->fileName).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pPVar3->fileName).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (pPVar3->fileName).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (__return_storage_ptr__->fileName).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar2 = pPVar3->colNumber;
  __return_storage_ptr__->lineNumber = pPVar3->lineNumber;
  __return_storage_ptr__->colNumber = sVar2;
  return __return_storage_ptr__;
}

Assistant:

ParseLocation location() { return cin->loc(); }